

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalextract.h
# Opt level: O0

uchar __thiscall
hbm::streaming::extract<unsigned_char,_(hbm::streaming::endian)1>::operator()
          (extract<unsigned_char,_(hbm::streaming::endian)1> *this,uchar **p)

{
  uint8_t uVar1;
  long *in_RSI;
  uchar value;
  swap_impl<1UL,_(hbm::streaming::endian)1> swapper;
  copy_type temp;
  
  uVar1 = swap_impl<1UL,_(hbm::streaming::endian)1>::swap(*(uint8_t *)*in_RSI);
  *in_RSI = *in_RSI + 1;
  return uVar1;
}

Assistant:

inline RET operator()(unsigned char **p) const
			{
				typename copy_traits<RET>::copy_type temp;
				std::memcpy(&temp, *p, sizeof(temp));
				swap_impl<sizeof(temp), e> swapper;
				temp = swapper.swap(temp);
				RET value;
				std::memcpy(&value, &temp, sizeof(value));
				*p = (*p) + sizeof(RET);
				return value;
			}